

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

void update_spsel(CPUARMState_conflict *env,uint32_t imm)

{
  uint el;
  uint32_t uVar1;
  uint cur_el;
  uint32_t imm_local;
  CPUARMState_conflict *env_local;
  
  el = arm_current_el(env);
  if (((imm ^ env->pstate) & 1) != 0) {
    aarch64_save_sp(env,el);
    uVar1 = deposit32(env->pstate,0,1,imm);
    env->pstate = uVar1;
    if ((el == 0) || (3 < el)) {
      __assert_fail("cur_el >= 1 && cur_el <= 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
                    ,0xdd,"void update_spsel(CPUARMState *, uint32_t)");
    }
    aarch64_restore_sp(env,el);
  }
  return;
}

Assistant:

static inline void update_spsel(CPUARMState *env, uint32_t imm)
{
    unsigned int cur_el = arm_current_el(env);
    /* Update PSTATE SPSel bit; this requires us to update the
     * working stack pointer in xregs[31].
     */
    if (!((imm ^ env->pstate) & PSTATE_SP)) {
        return;
    }
    aarch64_save_sp(env, cur_el);
    env->pstate = deposit32(env->pstate, 0, 1, imm);

    /* We rely on illegal updates to SPsel from EL0 to get trapped
     * at translation time.
     */
    assert(cur_el >= 1 && cur_el <= 3);
    aarch64_restore_sp(env, cur_el);
}